

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O1

void __thiscall
cbtHashedOverlappingPairCache::removeOverlappingPairsContainingProxy
          (cbtHashedOverlappingPairCache *this,cbtBroadphaseProxy *proxy,cbtDispatcher *dispatcher)

{
  RemovePairCallback removeCallback;
  undefined **local_10;
  cbtBroadphaseProxy *local_8;
  
  local_10 = &PTR__cbtOverlapCallback_00b6f5a0;
  local_8 = proxy;
  (*(this->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
    _vptr_cbtOverlappingPairCallback[0xc])(this,&local_10);
  return;
}

Assistant:

void cbtHashedOverlappingPairCache::removeOverlappingPairsContainingProxy(cbtBroadphaseProxy* proxy, cbtDispatcher* dispatcher)
{
	class RemovePairCallback : public cbtOverlapCallback
	{
		cbtBroadphaseProxy* m_obsoleteProxy;

	public:
		RemovePairCallback(cbtBroadphaseProxy* obsoleteProxy)
			: m_obsoleteProxy(obsoleteProxy)
		{
		}
		virtual bool processOverlap(cbtBroadphasePair& pair)
		{
			return ((pair.m_pProxy0 == m_obsoleteProxy) ||
					(pair.m_pProxy1 == m_obsoleteProxy));
		}
	};

	RemovePairCallback removeCallback(proxy);

	processAllOverlappingPairs(&removeCallback, dispatcher);
}